

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O1

Function * input(string *s)

{
  pointer pcVar1;
  Function *pFVar2;
  long *local_38 [2];
  long local_28 [2];
  
  pFVar2 = inputX();
  pcVar1 = (s->_M_dataplus)._M_p;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>((string *)local_38,pcVar1,pcVar1 + s->_M_string_length);
  std::__cxx11::string::_M_assign((string *)&pFVar2->sName);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return pFVar2;
}

Assistant:

Function &input(string s)
{
	return inputX().setName(s);
}